

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

int __thiscall
vkt::shaderexecutor::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  TestNode *pTVar1;
  TestContext *pTVar2;
  ulong uVar3;
  DataType local_78;
  DataType local_74;
  ShaderType local_48;
  int shaderType;
  DataType uintType;
  DataType intType;
  int vecSize;
  TestCaseGroup *uintGroup;
  TestCaseGroup *intGroup;
  deUint32 shaderBits;
  ShaderCommonFunctionTests *this_local;
  
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::AbsCase>
            (&this->super_TestCaseGroup,"abs",true,true,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::SignCase>
            (&this->super_TestCaseGroup,"sign",true,true,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FloorCase>
            (&this->super_TestCaseGroup,"floor",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::TruncCase>
            (&this->super_TestCaseGroup,"trunc",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::RoundCase>
            (&this->super_TestCaseGroup,"round",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::RoundEvenCase>
            (&this->super_TestCaseGroup,"roundeven",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::CeilCase>
            (&this->super_TestCaseGroup,"ceil",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FractCase>
            (&this->super_TestCaseGroup,"fract",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::ModfCase>
            (&this->super_TestCaseGroup,"modf",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::IsnanCase>
            (&this->super_TestCaseGroup,"isnan",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::IsinfCase>
            (&this->super_TestCaseGroup,"isinf",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FloatBitsToIntCase>
            (&this->super_TestCaseGroup,"floatbitstoint",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FloatBitsToUintCase>
            (&this->super_TestCaseGroup,"floatbitstouint",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FrexpCase>
            (&this->super_TestCaseGroup,"frexp",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::LdexpCase>
            (&this->super_TestCaseGroup,"ldexp",true,false,false,0x3f);
  shaderexecutor::anon_unknown_0::
  addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FmaCase>
            (&this->super_TestCaseGroup,"fma",true,false,false,0x3f);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "intbitstofloat","intBitsToFloat() Tests");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "uintbitstofloat","uintBitsToFloat() Tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uintType = TYPE_FLOAT;
  uVar3 = extraout_RAX;
  while ((int)uintType < 4) {
    if ((int)uintType < 2) {
      local_74 = TYPE_INT;
      local_78 = TYPE_UINT;
    }
    else {
      local_74 = glu::getDataTypeIntVec(uintType);
      local_78 = glu::getDataTypeUintVec(uintType);
    }
    for (local_48 = SHADERTYPE_VERTEX; (int)local_48 < 6; local_48 = local_48 + SHADERTYPE_FRAGMENT)
    {
      if ((1 << ((byte)local_48 & 0x1f) & 0x3cU) != 0) {
        pTVar1 = (TestNode *)operator_new(0xf0);
        pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
        shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar1,pTVar2,local_74,local_48);
        tcu::TestNode::addChild(node,pTVar1);
        pTVar1 = (TestNode *)operator_new(0xf0);
        pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
        shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar1,pTVar2,local_78,local_48);
        tcu::TestNode::addChild(node_00,pTVar1);
      }
    }
    uintType = uintType + TYPE_FLOAT;
    uVar3 = (ulong)uintType;
  }
  return (int)uVar3;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS,
		NEW_SHADERS = TC|TE|GS|CS,
	};

	//																	Float?	Int?	Uint?	Shaders
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false,	ALL_SHADERS);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false,	ALL_SHADERS);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false,	ALL_SHADERS);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false,	ALL_SHADERS);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false,	ALL_SHADERS);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false,	ALL_SHADERS);

	addFunctionCases<FrexpCase>				(this,	"frexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<LdexpCase>				(this,	"ldexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FmaCase>				(this,	"fma",				true,	false,	false,	ALL_SHADERS);

	// (u)intBitsToFloat()
	{
		const deUint32		shaderBits	= NEW_SHADERS;
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
			{
				if (shaderBits & (1<<shaderType))
				{
					intGroup->addChild(new BitsToFloatCase(getTestContext(), intType, glu::ShaderType(shaderType)));
					uintGroup->addChild(new BitsToFloatCase(getTestContext(), uintType, glu::ShaderType(shaderType)));
				}
			}
		}
	}
}